

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void rtreenode(sqlite3_context *ctx,int nArg,sqlite3_value **apArg)

{
  uint uVar1;
  i64 iVar2;
  void *pvVar3;
  sqlite3_str *p;
  char *z;
  byte bVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  undefined1 local_458 [16];
  undefined1 local_448 [16];
  RtreeNode *local_438;
  RtreeCell cell;
  Rtree local_400;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_458 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_438 = (RtreeNode *)0x0;
  memset(&local_400,0,0x3c8);
  iVar2 = sqlite3VdbeIntValue(*apArg);
  local_400.nDim = (u8)iVar2;
  if (0xfffffffa < ((uint)iVar2 & 0xff) - 6) {
    local_400.nDim2 = local_400.nDim * '\x02';
    bVar4 = local_400.nDim * '\b' + 8;
    local_400.nBytesPerCell = bVar4;
    pvVar3 = sqlite3_value_blob(apArg[1]);
    local_448._8_8_ = pvVar3;
    if (pvVar3 != (void *)0x0) {
      uVar1 = sqlite3_value_bytes(apArg[1]);
      if ((3 < (int)uVar1) &&
         ((uint)bVar4 *
          (uint)(ushort)(*(ushort *)((long)pvVar3 + 2) << 8 | *(ushort *)((long)pvVar3 + 2) >> 8) <=
          uVar1)) {
        p = sqlite3_str_new((sqlite3 *)0x0);
        for (uVar1 = 0;
            uVar1 < (ushort)(*(ushort *)((long)pvVar3 + 2) << 8 | *(ushort *)((long)pvVar3 + 2) >> 8
                            ); uVar1 = uVar1 + 1) {
          cell.iRowid = (i64)&DAT_aaaaaaaaaaaaaaaa;
          cell.aCoord[4].i = -1;
          cell.aCoord[5].i = -1;
          cell.aCoord[6].i = -1;
          cell.aCoord[7].i = -1;
          cell.aCoord[0].i = -1;
          cell.aCoord[1].i = -1;
          cell.aCoord[2].i = -1;
          cell.aCoord[3].i = -1;
          cell.aCoord[8] = (RtreeCoord)0xffffffff;
          cell.aCoord[9] = (RtreeCoord)0xffffffff;
          nodeGetCell(&local_400,(RtreeNode *)local_458,uVar1,&cell);
          if (uVar1 != 0) {
            sqlite3_str_append(p," ",1);
          }
          sqlite3_str_appendf(p,"{%lld",cell.iRowid);
          for (uVar5 = 0; ((uint)iVar2 & 0x7f) << 3 != uVar5; uVar5 = uVar5 + 4) {
            sqlite3_str_appendf(p," %g",(double)*(float *)((long)cell.aCoord + uVar5));
          }
          sqlite3_str_append(p,"}",1);
        }
        if (p == (sqlite3_str *)0x0) {
          uVar1 = 7;
        }
        else {
          uVar1 = (uint)p->accError;
        }
        sqlite3_result_error_code(ctx,uVar1);
        z = sqlite3_str_finish(p);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          sqlite3_result_text(ctx,z,-1,sqlite3_free);
          return;
        }
        goto LAB_001d8284;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_001d8284:
  __stack_chk_fail();
}

Assistant:

static void rtreenode(sqlite3_context *ctx, int nArg, sqlite3_value **apArg){
  RtreeNode node;
  Rtree tree;
  int ii;
  int nData;
  int errCode;
  sqlite3_str *pOut;

  UNUSED_PARAMETER(nArg);
  memset(&node, 0, sizeof(RtreeNode));
  memset(&tree, 0, sizeof(Rtree));
  tree.nDim = (u8)sqlite3_value_int(apArg[0]);
  if( tree.nDim<1 || tree.nDim>5 ) return;
  tree.nDim2 = tree.nDim*2;
  tree.nBytesPerCell = 8 + 8 * tree.nDim;
  node.zData = (u8 *)sqlite3_value_blob(apArg[1]);
  if( node.zData==0 ) return;
  nData = sqlite3_value_bytes(apArg[1]);
  if( nData<4 ) return;
  if( nData<NCELL(&node)*tree.nBytesPerCell ) return;

  pOut = sqlite3_str_new(0);
  for(ii=0; ii<NCELL(&node); ii++){
    RtreeCell cell;
    int jj;

    nodeGetCell(&tree, &node, ii, &cell);
    if( ii>0 ) sqlite3_str_append(pOut, " ", 1);
    sqlite3_str_appendf(pOut, "{%lld", cell.iRowid);
    for(jj=0; jj<tree.nDim2; jj++){
#ifndef SQLITE_RTREE_INT_ONLY
      sqlite3_str_appendf(pOut, " %g", (double)cell.aCoord[jj].f);
#else
      sqlite3_str_appendf(pOut, " %d", cell.aCoord[jj].i);
#endif
    }
    sqlite3_str_append(pOut, "}", 1);
  }
  errCode = sqlite3_str_errcode(pOut);
  sqlite3_result_error_code(ctx, errCode);
  sqlite3_result_text(ctx, sqlite3_str_finish(pOut), -1, sqlite3_free);
}